

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArraySamplingTest::getSamplingVertexShaderCode
          (TextureCubeMapArraySamplingTest *this,samplerType *sampler_type,
          samplingFunction *sampling_function,string *out_vertex_shader_code)

{
  samplingFunction sampling_function_00;
  samplerType sVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  attributeDefinition *paVar6;
  size_t sVar7;
  long *plVar8;
  GLuint n_components;
  char *color_type;
  bool bVar9;
  int iVar10;
  char *pcVar11;
  long lVar12;
  attributeDefinition *paVar13;
  bool *local_220;
  string sampling_code;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream stream;
  undefined1 local_1a8 [376];
  
  sampling_code._M_dataplus._M_p = (pointer)&sampling_code.field_2;
  sampling_code._M_string_length = 0;
  sampling_code.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  sampling_function_00 = *sampling_function;
  color_type = (char *)0x0;
  switch(sampling_function_00) {
  case Texture:
    paVar13 = getAttributes::texture_attributes;
    goto LAB_00d79430;
  case TextureLod:
    paVar13 = getAttributes::textureLod_attributes;
    iVar10 = 2;
    break;
  case TextureGrad:
    paVar13 = getAttributes::textureGrad_attributes;
    iVar10 = 3;
    break;
  case TextureGather:
    paVar13 = getAttributes::textureGather_attributes;
LAB_00d79430:
    iVar10 = 1;
    break;
  default:
    bVar9 = false;
    iVar10 = 0;
    paVar13 = (attributeDefinition *)0x0;
    goto LAB_00d79448;
  }
  bVar9 = true;
LAB_00d79448:
  sVar1 = *sampler_type;
  paVar6 = getAttributes::depth_attributes;
  if (sVar1 != Depth) {
    paVar6 = (attributeDefinition *)color_type;
  }
  bVar5 = true;
  bVar4 = true;
  switch(sVar1) {
  case Float:
    pcVar11 = "samplerCubeArray ";
    n_components = 4;
    local_220 = fixed_sample_locations_values + 1;
    color_type = "vec4 ";
    bVar4 = bVar5;
    break;
  case Int:
    pcVar11 = "isamplerCubeArray ";
    n_components = 4;
    local_220 = (bool *)0x1b77351;
    color_type = "ivec4 ";
    bVar4 = bVar5;
    break;
  case UInt:
    pcVar11 = "usamplerCubeArray ";
    n_components = 4;
    local_220 = (bool *)0x1b77351;
    color_type = "uvec4 ";
    bVar4 = bVar5;
    break;
  case Depth:
    pcVar11 = "samplerCubeArrayShadow ";
    n_components = 1;
    local_220 = fixed_sample_locations_values + 1;
    color_type = "float ";
    bVar4 = false;
    break;
  case Stencil:
    pcVar11 = "usamplerCubeArray ";
    n_components = 1;
    local_220 = (bool *)0x1b77351;
    color_type = "uint ";
    bVar4 = bVar5;
    break;
  default:
    local_220 = (bool *)0x0;
    n_components = 0;
    bVar5 = true;
    pcVar11 = (char *)0x0;
    goto LAB_00d79539;
  }
  bVar5 = false;
LAB_00d79539:
  if (bVar4) {
    getSamplingFunctionCall
              ((TextureCubeMapArraySamplingTest *)0x1a9f87f,sampling_function_00,color_type,
               n_components,"vs_in_",(GLchar *)0x0,"fs_in_color",(GLchar *)0x0,"sampler",
               &sampling_code);
  }
  else {
    getShadowSamplingFunctionCall
              ((TextureCubeMapArraySamplingTest *)0x1a9f87f,sampling_function_00,color_type,
               n_components,"vs_in_",(GLchar *)0x0,"fs_in_color",(GLchar *)0x0,"sampler",
               &sampling_code);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"${VERSION}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"precision highp float;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"/* Sampling vertex shader */",0x1c);
  cVar2 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"uniform ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"highp ",6);
  iVar3 = (int)(ostream *)local_1a8;
  if (bVar5) {
    std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar7 = strlen(pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"sampler",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vec4 ",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vs_in_",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"position",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (bVar9) {
    lVar12 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
      pcVar11 = *(char **)((long)&paVar13->type + lVar12);
      if (pcVar11 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar7 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vs_in_",6);
      pcVar11 = *(char **)((long)&paVar13->name + lVar12);
      if (pcVar11 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar7 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
      std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      lVar12 = lVar12 + 0x18;
    } while ((ulong)(iVar10 + (uint)(iVar10 == 0)) * 0x18 != lVar12);
  }
  if (sVar1 == Depth) {
    bVar9 = true;
    lVar12 = 0;
    while (bVar9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
      pcVar11 = paVar6[lVar12].type;
      if (pcVar11 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar7 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vs_in_",6);
      pcVar11 = paVar6[lVar12].name;
      if (pcVar11 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar7 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
      std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
      std::ostream::put(cVar2);
      lVar12 = 1;
      bVar9 = false;
      std::ostream::flush();
    }
  }
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (bVar5) {
    std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar7 = strlen(local_220);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_220,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out ",4);
  if (bVar5) {
    std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar7 = strlen(color_type);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,color_type,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"fs_in_color",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "void main()\n{\n    gl_PointSize = 1.0f;\n    gl_Position = vs_in_position;\n",0x49);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,sampling_code._M_dataplus._M_p,sampling_code._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  plVar8 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_vertex_shader_code,(string *)local_1d8);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sampling_code._M_dataplus._M_p != &sampling_code.field_2) {
    operator_delete(sampling_code._M_dataplus._M_p,
                    CONCAT71(sampling_code.field_2._M_allocated_capacity._1_7_,
                             sampling_code.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getSamplingVertexShaderCode(const samplerType&	  sampler_type,
																  const samplingFunction& sampling_function,
																  std::string&			  out_vertex_shader_code)
{
	const glw::GLchar*		   color_type					 = 0;
	const glw::GLchar*		   interpolation_type			 = 0;
	bool					   is_shadow_sampler			 = false;
	glw::GLuint				   n_components					 = 0;
	glw::GLuint				   n_routine_attributes			 = 0;
	glw::GLuint				   n_type_attributes			 = 0;
	const attributeDefinition* routine_attribute_definitions = 0;
	const attributeDefinition* type_attribute_definitions	= 0;
	const glw::GLchar*		   sampler_type_str				 = 0;
	std::string				   sampling_code;
	std::stringstream		   stream;

	/* Get attributes for sampling function */
	getAttributes(sampling_function, routine_attribute_definitions, n_routine_attributes);
	getAttributes(sampler_type, type_attribute_definitions, n_type_attributes);

	/* Get type for color variables */
	getColorType(sampler_type, color_type, interpolation_type, sampler_type_str, n_components, is_shadow_sampler);

	/* Get sampling code */
	if (false == is_shadow_sampler)
	{
		getSamplingFunctionCall(sampling_function, color_type, n_components, vertex_shader_input, 0,
								fragment_shader_input, 0, sampler_name, sampling_code);
	}
	else
	{
		getShadowSamplingFunctionCall(sampling_function, color_type, n_components, vertex_shader_input, 0,
									  fragment_shader_input, 0, sampler_name, sampling_code);
	}

	/* Preamble */
	stream << shader_code_preamble << shader_precision << "/* Sampling vertex shader */" << std::endl;

	/* uniform samplerType sampler */
	stream << shader_uniform << "highp " << sampler_type_str << sampler_name << ";" << std::endl;

	stream << std::endl;

	/* in vec4 vs_in_position */
	stream << shader_input << type_vec4 << vertex_shader_input << vertex_shader_position << ";" << std::endl;

	/* in type attribute */
	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		stream << shader_input << routine_attribute_definitions[i].type << vertex_shader_input
			   << routine_attribute_definitions[i].name << ";" << std::endl;
	}
	for (glw::GLuint i = 0; i < n_type_attributes; ++i)
	{
		stream << shader_input << type_attribute_definitions[i].type << vertex_shader_input
			   << type_attribute_definitions[i].name << ";" << std::endl;
	}

	stream << std::endl;

	/* out vec4 fs_in_color; */
	stream << interpolation_type << shader_output << color_type << fragment_shader_input << ";" << std::endl;

	stream << std::endl;

	/* Body */
	stream << vertex_shader_body_code;

	/* Sampling code */
	stream << sampling_code;

	stream << "}" << std::endl << std::endl;

	/* Store result */
	out_vertex_shader_code = stream.str();
}